

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_>::dispose
          (ArrayBuilder<kj::Own<capnp::_::SegmentBuilder>_> *this)

{
  Own<capnp::_::SegmentBuilder> *pOVar1;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar2;
  Own<capnp::_::SegmentBuilder> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Own<capnp::_::SegmentBuilder> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    this->ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    this->pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pOVar1,0x10,(long)pRVar2 - (long)pOVar1 >> 4,
               (long)pOVar3 - (long)pOVar1 >> 4,
               ArrayDisposer::Dispose_<kj::Own<capnp::_::SegmentBuilder>,_false>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }